

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTracker<ObjectTempVerify>::MergeData
          (TempTracker<ObjectTempVerify> *this,TempTracker<ObjectTempVerify> *fromData,
          bool deleteData)

{
  JitArenaAllocator *allocator;
  bool deleteData_local;
  TempTracker<ObjectTempVerify> *fromData_local;
  TempTracker<ObjectTempVerify> *this_local;
  
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  ObjectTempVerify::MergeData
            (&this->super_ObjectTempVerify,&fromData->super_ObjectTempVerify,deleteData);
  if (deleteData) {
    allocator = TempTrackerBase::GetAllocator((TempTrackerBase *)this);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<ObjectTempVerify>>
              (allocator,fromData);
  }
  return;
}

Assistant:

void
TempTracker<T>::MergeData(TempTracker<T> * fromData, bool deleteData)
{
    TempTrackerBase::MergeData(fromData, deleteData);
    T::MergeData(fromData, deleteData);

    if (deleteData)
    {
        JitAdelete(this->GetAllocator(), fromData);
    }
}